

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O0

void P_SerializeWorldActors(FArchive *arc)

{
  bool bVar1;
  FArchive *pFVar2;
  FSectorPortal *pFVar3;
  int local_4c;
  int s_1;
  FSectorPortal *s;
  iterator __end1;
  iterator __begin1;
  TArray<FSectorPortal,_FSectorPortal> *__range1;
  line_t *line;
  sector_t *sec;
  int i;
  FArchive *arc_local;
  
  line = (line_t *)sectors;
  for (sec._4_4_ = 0; sec._4_4_ < numsectors; sec._4_4_ = sec._4_4_ + 1) {
    pFVar2 = operator<<(arc,(TObjPtr<AActor> *)(line[1].bbox + 3));
    pFVar2 = operator<<(pFVar2,(TObjPtr<ASectorAction> *)&line[3].flags);
    pFVar2 = operator<<(pFVar2,(TObjPtr<DSectorEffect> *)&line[2].special);
    pFVar2 = operator<<(pFVar2,(TObjPtr<DSectorEffect> *)(line[2].args + 1));
    operator<<(pFVar2,(TObjPtr<DSectorEffect> *)(line[2].args + 3));
    line = (line_t *)&line[4].v2;
  }
  __end1 = TArray<FSectorPortal,_FSectorPortal>::begin(&sectorPortals);
  s = (FSectorPortal *)TArray<FSectorPortal,_FSectorPortal>::end(&sectorPortals);
  while( true ) {
    bVar1 = TIterator<FSectorPortal>::operator!=(&__end1,(TIterator<FSectorPortal> *)&s);
    if (!bVar1) break;
    pFVar3 = TIterator<FSectorPortal>::operator*(&__end1);
    operator<<(arc,&pFVar3->mSkybox);
    TIterator<FSectorPortal>::operator++(&__end1);
  }
  __range1 = (TArray<FSectorPortal,_FSectorPortal> *)lines;
  for (sec._4_4_ = 0; sec._4_4_ < numlines; sec._4_4_ = sec._4_4_ + 1) {
    for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
      if (*(long *)(&__range1[4].Most + (long)local_4c * 2) != 0) {
        DBaseDecal::SerializeChain
                  (arc,(DBaseDecal **)(*(long *)(&__range1[4].Most + (long)local_4c * 2) + 8));
      }
    }
    __range1 = (TArray<FSectorPortal,_FSectorPortal> *)&__range1[9].Most;
  }
  return;
}

Assistant:

void P_SerializeWorldActors(FArchive &arc)
{
	int i;
	sector_t *sec;
	line_t *line;

	for (i = 0, sec = sectors; i < numsectors; i++, sec++)
	{
		arc << sec->SoundTarget
			<< sec->SecActTarget
			<< sec->floordata
			<< sec->ceilingdata
			<< sec->lightingdata;
	}
	for (auto &s : sectorPortals)
	{
		arc << s.mSkybox;
	}
	for (i = 0, line = lines; i < numlines; i++, line++)
	{
		for (int s = 0; s < 2; s++)
		{
			if (line->sidedef[s] != NULL)
			{
				DBaseDecal::SerializeChain(arc, &line->sidedef[s]->AttachedDecals);
			}
		}
	}
}